

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::Logger::resolveLoggerFormatSpec(Logger *this)

{
  anon_class_16_2_455e6bc1 local_48;
  function<bool_()> local_38;
  EnumType local_14;
  Logger *pLStack_10;
  EnumType lIndex;
  Logger *this_local;
  
  local_14 = 2;
  local_48.this = this;
  local_48.lIndex = &local_14;
  pLStack_10 = this;
  std::function<bool()>::function<el::Logger::resolveLoggerFormatSpec()const::__0,void>
            ((function<bool()> *)&local_38,&local_48);
  LevelHelper::forEachLevel(&local_14,&local_38);
  el::base::utils::std::function<bool_()>::~function(&local_38);
  return;
}

Assistant:

void Logger::resolveLoggerFormatSpec(void) const {
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    base::LogFormat* logFormat =
    const_cast<base::LogFormat*>(&m_typedConfigurations->logFormat(LevelHelper::castFromInt(lIndex)));
    base::utils::Str::replaceFirstWithEscape(logFormat->m_format, base::consts::kLoggerIdFormatSpecifier, m_id);
    return false;
  });
}